

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O3

ostream * operator<<(ostream *os,NodeView *nv)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"NodeView: Node ",0xf);
  poVar1 = std::ostream::_M_insert<long>((long)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," in ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(nv->dg->name)._M_dataplus._M_p,(nv->dg->name)._M_string_length);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const NodeView &nv) {
    os << "NodeView: Node "<<nv.id<<" in "<<nv.dg->name;
    return os;
}